

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::computeSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  element_type *peVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  size_t n;
  ulong uVar6;
  string ngram;
  value_type local_58;
  vector<int,_std::allocator<int>_> *local_38;
  
  if (word->_M_string_length != 0) {
    uVar3 = 0;
    local_38 = ngrams;
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      if (uVar3 < word->_M_string_length) {
        uVar6 = 1;
        uVar4 = uVar3;
        do {
          if ((ulong)(long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           maxn < uVar6) break;
          std::__cxx11::string::push_back((char)&local_58);
          uVar4 = uVar4 + 1;
          peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((ulong)(long)peVar1->minn <= uVar6) {
            if ((uVar6 != 1) || (uVar3 != 0 && uVar4 != word->_M_string_length)) {
              uVar2 = 0x811c9dc5;
              if (local_58._M_string_length != 0) {
                sVar5 = 0;
                do {
                  uVar2 = ((int)local_58._M_dataplus._M_p[sVar5] ^ uVar2) * 0x1000193;
                  sVar5 = sVar5 + 1;
                } while (local_58._M_string_length != sVar5);
              }
              pushHash(this,local_38,uVar2 % (uint)peVar1->bucket);
              if (substrings !=
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(substrings,&local_58);
              }
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 < word->_M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < word->_M_string_length);
  }
  return;
}

Assistant:

void Dictionary::computeSubwords(const std::string& word,
                               std::vector<int32_t>& ngrams,
                               std::vector<std::string>* substrings) const {
  for (size_t i = 0; i < word.size(); i++) {
    std::string ngram;
    if ((word[i] & 0xC0) == 0x80) continue;
    for (size_t j = i, n = 1; j < word.size() && n <= args_->maxn; n++) {
      ngram.push_back(word[j++]);
      while (j < word.size() && (word[j] & 0xC0) == 0x80) {
        ngram.push_back(word[j++]);
      }
      if (n >= args_->minn && !(n == 1 && (i == 0 || j == word.size()))) {
        int32_t h = hash(ngram) % args_->bucket;
        pushHash(ngrams, h);
        if (substrings) {
          substrings->push_back(ngram);
        }
      }
    }
  }
}